

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O2

bool dg::pta::PointerAnalysisFSInv::invStrongUpdate(PSNode *operand)

{
  bool bVar1;
  size_t sVar2;
  Pointer PVar3;
  const_iterator cStack_28;
  
  sVar2 = ADT::
          SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
          ::size((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                  *)(operand + 0xb0));
  if (sVar2 == 1) {
    ADT::
    SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
    ::begin(&cStack_28,
            (SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
             *)(operand + 0xb0));
    PVar3 = PointerIdPointsToSet::const_iterator::operator*((const_iterator *)&cStack_28);
    if ((PVar3.offset.offset.offset != Offset::UNKNOWN) &&
       (bVar1 = isInvalidTarget(PVar3.target), !bVar1)) {
      bVar1 = knownInstance(PVar3.target);
      return bVar1;
    }
  }
  return false;
}

Assistant:

static bool invStrongUpdate(const PSNode *operand) {
        // If we are freeing memory through node that
        // points to precisely known valid memory that is not allocated
        // on a loop, we can do strong update.
        //
        // TODO: we can do strong update also on must-aliases
        // of the invalidated pointer. That is, e.g. for
        // free(p), we may do strong update for q if q is must-alias
        // of p (no matter the size of p's and q's points-to sets)
        if (operand->pointsTo.size() != 1)
            return false;

        const auto &ptr = *(operand->pointsTo.begin());
        return !ptr.offset.isUnknown() && !isInvalidTarget(ptr.target) &&
               knownInstance(ptr.target);
    }